

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O0

void CreateBackwardReferencesNH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  ulong in_RCX;
  long in_RDX;
  char *in_RSI;
  ulong in_RDI;
  long in_R8;
  long in_R9;
  bool bVar10;
  long in_stack_00000008;
  int *in_stack_00000010;
  ulong *in_stack_00000018;
  undefined4 *in_stack_00000020;
  long *in_stack_00000028;
  long *in_stack_00000030;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  int delayed_backward_references_in_row;
  uint8_t p2;
  uint8_t p1;
  int dict_id;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H55 *privat;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  uint32_t delta;
  size_t nbits;
  size_t offset;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  uint32_t nbits_2;
  uint32_t offset_1;
  uint16_t bits64;
  size_t b_5;
  size_t a_5;
  size_t b_4;
  size_t a_4;
  size_t b_1;
  size_t a_1;
  size_t b;
  size_t a;
  size_t b_3;
  size_t a_3;
  size_t b_2;
  size_t a_2;
  size_t score_1;
  size_t backward;
  size_t len_1;
  size_t i;
  size_t keys [4];
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t key_out;
  size_t key;
  int compare_char;
  size_t cur_ix_masked;
  size_t best_len_in;
  uint32_t *buckets;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  uint64_t t_1;
  uint64_t t;
  uint64_t t_3;
  uint64_t t_2;
  size_t score_4;
  size_t backward_2;
  size_t len_4;
  size_t i_1;
  size_t keys_1 [4];
  size_t score_3;
  size_t len_3;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t key_out_1;
  size_t key_1;
  int compare_char_1;
  size_t cur_ix_masked_2;
  size_t best_len_in_1;
  uint32_t *buckets_1;
  size_t matching_bits_4;
  uint64_t x_4;
  uint8_t *s1_orig_4;
  size_t matching_bits_3;
  uint64_t x_3;
  uint8_t *s1_orig_3;
  uint64_t t_7;
  uint64_t t_6;
  uint64_t t_9;
  uint64_t t_8;
  size_t score_2;
  size_t len_2;
  size_t found_ix_masked;
  size_t backward_1;
  size_t found_ix;
  uint8_t add;
  uint8_t rem;
  uint32_t code;
  size_t pos;
  size_t cur_ix_masked_1;
  size_t matching_bits_2;
  uint64_t x_2;
  uint8_t *s1_orig_2;
  uint64_t t_5;
  uint64_t t_4;
  size_t score_5;
  size_t len_5;
  size_t found_ix_masked_1;
  size_t backward_3;
  size_t found_ix_1;
  uint8_t add_1;
  uint8_t rem_1;
  uint32_t code_1;
  size_t pos_1;
  size_t cur_ix_masked_3;
  size_t matching_bits_5;
  uint64_t x_5;
  uint8_t *s1_orig_5;
  uint64_t t_11;
  uint64_t t_10;
  size_t i_2;
  uint32_t off;
  uint32_t key_2;
  uint32_t off_1;
  uint32_t key_3;
  uint32_t off_2;
  uint32_t key_4;
  char *local_d18;
  undefined8 in_stack_fffffffffffff2f8;
  char *in_stack_fffffffffffff300;
  char *local_ce8;
  char *local_ce0;
  char *local_cd0;
  char *local_cb8;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c68;
  char *local_c60;
  char *local_c48;
  char *local_bf8;
  char *local_be8;
  char *local_be0;
  ulong local_bd8;
  undefined4 local_bd0;
  undefined4 uStack_bcc;
  undefined8 local_bc8;
  int local_bbc;
  byte local_bb6;
  byte local_bb5;
  uint local_bb4;
  char *local_bb0;
  char *local_ba8;
  ulong local_ba0;
  ulong local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  undefined8 local_b78;
  long local_b70;
  char *local_b68;
  long local_b60;
  char *local_b58;
  char *local_b50;
  ulong local_b48;
  undefined4 *local_b40;
  long local_b38;
  char *local_b30;
  long local_b28;
  long local_b20;
  long local_b18;
  ulong local_b10;
  long local_b08;
  char *local_b00;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  ulong local_a48;
  ulong local_a40;
  char *local_a38;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  uint local_a0c;
  char *local_a08;
  uint local_9fc;
  char *local_9f8;
  ulong local_9f0;
  uint *local_9e8;
  undefined4 *local_9e0;
  undefined8 local_9d8;
  undefined8 local_9d0;
  undefined8 local_9c8;
  undefined8 local_9c0;
  char *local_9b8;
  char *local_9b0;
  long local_9a8;
  long local_9a0;
  ulong local_998;
  ulong local_990;
  ulong local_988;
  ulong local_980;
  char *local_978;
  undefined4 *local_970;
  ushort *local_968;
  ulong local_960;
  ulong local_958;
  char *local_950;
  char *local_948;
  ushort local_93c;
  ushort local_93a;
  ushort *local_938;
  uint local_92c;
  ulong local_928;
  ulong local_920;
  int local_914;
  ulong local_910;
  ushort local_902;
  long local_900;
  long local_8f8;
  int local_8ec;
  ulong local_8e8;
  ushort local_8da;
  long local_8d8;
  long local_8d0;
  int local_8c4;
  ushort local_8be;
  uint local_8bc;
  ushort local_8b6;
  ushort local_8b4;
  ushort local_8b2;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined8 local_878;
  long local_868;
  long local_858;
  undefined8 local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined8 local_838;
  char **local_830;
  undefined8 local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  int *local_800;
  ulong local_7f8;
  long local_7f0;
  undefined8 local_7e8;
  long local_7e0;
  char **local_7d8;
  undefined8 local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  int *local_7a8;
  ulong local_7a0;
  long local_798;
  undefined8 local_790;
  long local_788;
  char *local_780;
  char *local_778;
  ulong local_770;
  long local_768;
  long local_760;
  char *local_758;
  ulong local_750;
  long local_748;
  long local_740;
  char *local_738;
  ulong local_730;
  long local_728;
  long local_720;
  long local_710;
  long local_700;
  long local_6f0;
  long local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  ulong local_6c0;
  ulong auStack_6b8 [4];
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  long local_660;
  ulong local_658;
  uint local_64c;
  ulong local_648;
  char *local_640;
  long local_638;
  char **local_630;
  undefined8 local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  int *local_600;
  ulong local_5f8;
  long local_5f0;
  undefined8 local_5e8;
  long local_5e0;
  ulong local_5d8;
  ulong local_5d0;
  ulong *local_5c8;
  char *local_5c0;
  ulong *local_5b8;
  ulong *local_5b0;
  char *local_5a8;
  ulong local_5a0;
  ulong local_598;
  ulong *local_590;
  char *local_588;
  ulong *local_580;
  ulong *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  ulong local_550;
  ulong *local_548;
  ulong local_540;
  ulong *local_538;
  ulong local_530;
  ulong *local_528;
  ulong local_520;
  ulong *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  ulong local_4f0;
  ulong auStack_4e8 [5];
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  long local_488;
  ulong local_480;
  uint local_474;
  ulong local_470;
  char *local_468;
  long local_460;
  char **local_458;
  undefined8 local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  int *local_428;
  ulong local_420;
  long local_418;
  undefined8 local_410;
  long local_408;
  ulong local_400;
  ulong local_3f8;
  ulong *local_3f0;
  char *local_3e8;
  ulong *local_3e0;
  ulong *local_3d8;
  char *local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  ulong *local_3b8;
  char *local_3b0;
  ulong *local_3a8;
  ulong *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  ulong local_378;
  ulong *local_370;
  ulong local_368;
  ulong *local_360;
  ulong local_358;
  ulong *local_350;
  ulong local_348;
  ulong *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  ulong local_320;
  char *local_318;
  ulong local_310;
  undefined1 local_306;
  undefined1 local_305;
  uint local_304;
  char *local_300;
  ulong local_2f8;
  char **local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  int *local_2c0;
  ulong local_2b8;
  long local_2b0;
  undefined8 local_2a8;
  uint *local_2a0;
  ulong local_298;
  ulong local_290;
  ulong *local_288;
  char *local_280;
  ulong *local_278;
  ulong *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  ulong local_250;
  ulong *local_248;
  ulong local_240;
  ulong *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ulong local_218;
  char *local_210;
  ulong local_208;
  undefined1 local_1fe;
  undefined1 local_1fd;
  uint local_1fc;
  char *local_1f8;
  ulong local_1f0;
  char **local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  int *local_1b8;
  ulong local_1b0;
  long local_1a8;
  undefined8 local_1a0;
  uint *local_198;
  ulong local_190;
  ulong local_188;
  ulong *local_180;
  char *local_178;
  ulong *local_170;
  ulong *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  ulong local_148;
  ulong *local_140;
  ulong local_138;
  ulong *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  ulong local_108;
  long local_100;
  long local_f8;
  char *local_f0;
  char *local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  uint local_c8;
  uint32_t local_c4;
  char *local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  uint local_a0;
  uint32_t local_9c;
  char *local_98;
  ulong local_90;
  long local_88;
  long local_80;
  uint local_78;
  uint32_t local_74;
  char *local_70;
  ulong local_68;
  long local_60;
  long local_58;
  char *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  char *local_30;
  ulong local_28;
  long local_20;
  long local_18;
  
  local_b28 = in_stack_00000008 + 0x50;
  local_b30 = (char *)((1L << ((byte)*(undefined4 *)(in_R9 + 8) & 0x3f)) + -0x10);
  local_b38 = *(long *)(in_R9 + 0x10);
  local_b40 = in_stack_00000020;
  local_b48 = *in_stack_00000018;
  local_b50 = in_RSI + in_RDI;
  local_878 = 8;
  local_880 = 4;
  local_c48 = in_RSI;
  if (7 < in_RDI) {
    local_888 = 8;
    local_890 = 4;
    local_c48 = in_RSI + (in_RDI - 7);
  }
  local_b58 = local_c48;
  iVar5 = 0x200;
  if (*(int *)(in_R9 + 4) < 9) {
    iVar5 = 0x40;
  }
  local_b60 = (long)iVar5;
  local_b68 = in_RSI + local_b60;
  local_b70 = *(long *)(in_R9 + 0x60);
  local_b78 = 0x7e4;
  local_6f0 = in_stack_00000008 + 0x60;
  local_b20 = in_R9;
  local_b18 = in_R8;
  local_b10 = in_RCX;
  local_b08 = in_RDX;
  pcVar7 = in_RSI;
  local_858 = local_b28;
  local_710 = local_b28;
LAB_007ea339:
  do {
    local_b00 = pcVar7;
    local_838 = 8;
    local_840 = 4;
    if (local_b50 <= local_b00 + 8) {
      *in_stack_00000018 = (ulong)(local_b50 + (local_b48 - (long)local_b00));
      *in_stack_00000028 = ((long)in_stack_00000020 - (long)local_b40 >> 4) + *in_stack_00000028;
      return;
    }
    local_b80 = local_b50 + -(long)local_b00;
    local_a50 = local_b00;
    local_a58 = local_b30;
    if (local_b00 < local_b30) {
      local_c60 = local_b00;
    }
    else {
      local_c60 = local_b30;
    }
    local_b88 = local_c60;
    local_a60 = local_b00 + local_b38;
    local_a68 = local_b30;
    local_c68 = local_a60;
    if (local_b30 <= local_a60) {
      local_c68 = local_b30;
    }
    local_b90 = local_c68;
    local_bb4 = 0;
    local_bb5 = 0;
    local_bb6 = 0;
    if (*(int *)(local_b20 + 0x270) != 0) {
      if (local_b00 == (char *)0x0) {
        local_bb5 = 0;
      }
      else {
        local_bb5 = *(byte *)(local_b08 + ((ulong)(local_b00 + -1) & local_b10));
      }
      if (local_b00 < (char *)0x2) {
        local_bb6 = 0;
      }
      else {
        local_bb6 = *(byte *)(local_b08 + ((ulong)(local_b00 + -2) & local_b10));
      }
      local_bb4 = (uint)*(byte *)(local_b20 + 0x275 +
                                 (long)(int)(uint)(*(byte *)(local_b18 + (ulong)local_bb5) |
                                                  *(byte *)(local_b18 + 0x100 + (ulong)local_bb6)));
    }
    local_bb0 = (char *)0x0;
    local_b98 = local_b98 & 0xffffffff00000000;
    local_ba8 = (char *)0x0;
    local_ba0 = 0x7e4;
    local_790 = *(undefined8 *)(local_b20 + 0x2b8 + (long)(int)local_bb4 * 8);
    local_7c8 = local_c68 + local_b70;
    local_7d0 = *(undefined8 *)(local_b20 + 0x48);
    local_788 = local_b28;
    local_798 = local_b08;
    local_7a0 = local_b10;
    local_7a8 = in_stack_00000010;
    local_7b0 = local_b00;
    local_7c0 = local_c60;
    local_7d8 = &local_bb0;
    local_5e0 = local_b28;
    local_5f0 = local_b08;
    local_5f8 = local_b10;
    local_600 = in_stack_00000010;
    local_608 = local_b00;
    local_618 = local_c60;
    local_638 = *(long *)(local_b28 + 8);
    local_640 = (char *)0x0;
    local_648 = (ulong)local_b00 & local_b10;
    local_64c = (uint)*(byte *)(local_b08 + local_648);
    local_7b8 = local_b80;
    local_630 = local_7d8;
    local_628 = local_7d0;
    local_620 = local_7c8;
    local_610 = local_b80;
    local_5e8 = local_790;
    uVar3 = duckdb_brotli::HashBytesH54((uint8_t *)(local_b08 + local_648));
    local_658 = (ulong)uVar3;
    local_668 = local_630[2];
    local_670 = local_630[2];
    local_678 = local_640;
    local_680 = (char *)(long)*local_600;
    local_688 = local_608 + -(long)*local_600;
    *(undefined4 *)(local_630 + 3) = 0;
    if (local_688 < local_608) {
      local_688 = (char *)(local_5f8 & 0xffffffff & (ulong)local_688);
      if (local_64c == (byte)(local_688 + (long)local_678)[local_5f0]) {
        local_590 = (ulong *)(local_688 + local_5f0);
        local_578 = local_590;
        local_580 = (ulong *)(local_5f0 + local_648);
        local_588 = local_610;
LAB_007ea8f9:
        if (local_588 < (char *)0x8) {
          while( true ) {
            bVar10 = false;
            if (local_588 != (char *)0x0) {
              bVar10 = (char)*local_578 == (char)*local_580;
            }
            if (!bVar10) break;
            local_588 = local_588 + -1;
            local_580 = (ulong *)((long)local_580 + 1);
            local_578 = (ulong *)((long)local_578 + 1);
          }
          local_570 = (char *)((long)local_578 - (long)local_590);
        }
        else {
          local_538 = local_580;
          local_540 = *local_580;
          local_548 = local_578;
          local_550 = *local_578;
          uVar6 = *local_580 ^ *local_578;
          local_598 = uVar6;
          local_580 = local_580 + 1;
          if (uVar6 == 0) break;
          iVar5 = 0;
          for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
            iVar5 = iVar5 + 1;
          }
          local_5a0 = (long)iVar5;
          local_570 = (char *)((long)local_578 + (((ulong)(long)iVar5 >> 3) - (long)local_590));
        }
        local_690 = local_570;
        if ((char *)0x3 < local_570) {
          local_568 = local_570;
          local_698 = (char *)((long)local_570 * 0x87 + 0x78f);
          if (local_670 < local_698) {
            *local_630 = local_570;
            local_630[1] = local_680;
            local_630[2] = local_698;
            local_678 = local_690;
            local_670 = local_698;
            local_64c = (uint)(byte)local_690[local_5f0 + local_648];
          }
        }
      }
    }
    for (local_6c0 = 0; local_6c0 < 4; local_6c0 = local_6c0 + 1) {
      auStack_6b8[local_6c0] = local_658 + local_6c0 * 8 & 0xfffff;
    }
    local_660 = *(long *)((long)auStack_6b8 + ((ulong)local_608 & 0x18));
    for (local_6c0 = 0; local_6c0 < 4; local_6c0 = local_6c0 + 1) {
      uVar6 = (ulong)*(uint *)(local_638 + auStack_6b8[local_6c0] * 4);
      local_6d0 = local_608 + -uVar6;
      local_688 = (char *)(local_5f8 & 0xffffffff & uVar6);
      if ((local_64c == (byte)(local_688 + (long)local_678)[local_5f0]) &&
         (local_6d0 != (char *)0x0 && local_6d0 <= local_618)) {
        local_5c8 = (ulong *)(local_688 + local_5f0);
        local_5b0 = local_5c8;
        local_5b8 = (ulong *)(local_5f0 + local_648);
        local_5c0 = local_610;
LAB_007ead23:
        if (local_5c0 < (char *)0x8) {
          while( true ) {
            bVar10 = false;
            if (local_5c0 != (char *)0x0) {
              bVar10 = (char)*local_5b0 == (char)*local_5b8;
            }
            if (!bVar10) break;
            local_5c0 = local_5c0 + -1;
            local_5b8 = (ulong *)((long)local_5b8 + 1);
            local_5b0 = (ulong *)((long)local_5b0 + 1);
          }
          local_5a8 = (char *)((long)local_5b0 - (long)local_5c8);
        }
        else {
          local_518 = local_5b8;
          local_520 = *local_5b8;
          local_528 = local_5b0;
          local_530 = *local_5b0;
          uVar6 = *local_5b8 ^ *local_5b0;
          local_5d0 = uVar6;
          local_5b8 = local_5b8 + 1;
          if (uVar6 == 0) goto LAB_007eadf5;
          iVar5 = 0;
          for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
            iVar5 = iVar5 + 1;
          }
          local_5d8 = (long)iVar5;
          local_5a8 = (char *)((long)local_5b0 + (((ulong)(long)iVar5 >> 3) - (long)local_5c8));
        }
        local_6c8 = local_5a8;
        if ((char *)0x3 < local_5a8) {
          local_558 = local_5a8;
          local_560 = local_6d0;
          local_510 = local_6d0;
          iVar5 = 0x1f;
          if ((uint)local_6d0 != 0) {
            for (; (uint)local_6d0 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          local_6d8 = (char *)(((long)local_5a8 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e));
          if (local_670 < local_6d8) {
            local_678 = local_5a8;
            *local_630 = local_5a8;
            local_64c = (uint)(byte)local_6c8[local_5f0 + local_648];
            local_670 = local_6d8;
            local_630[2] = local_6d8;
            local_630[1] = local_6d0;
          }
        }
      }
    }
    *(int *)(local_638 + local_660 * 4) = (int)local_608;
    local_2a0 = (uint *)(local_788 + 0x10);
    local_2a8 = local_790;
    local_2b0 = local_798;
    local_2b8 = local_7a0;
    local_2c0 = local_7a8;
    local_2c8 = local_7b0;
    local_2d0 = local_7b8;
    local_2d8 = local_7c0;
    local_2e0 = local_7c8;
    local_2e8 = local_7d0;
    local_2f0 = local_7d8;
    local_2f8 = (ulong)local_7b0 & local_7a0;
    if ((((ulong)local_7b0 & 3) == 0) && ((char *)0x1f < local_7b8)) {
      for (local_300 = *(char **)(local_788 + 0x20); local_300 <= local_2c8;
          local_300 = local_300 + 4) {
        local_304 = *local_2a0 & 0x3fffffff;
        local_305 = *(undefined1 *)(local_2b0 + ((ulong)local_300 & local_2b8));
        local_306 = *(undefined1 *)(local_2b0 + ((ulong)(local_300 + 0x20) & local_2b8));
        local_310 = 0xffffffff;
        uVar3 = duckdb_brotli::HashRollingFunctionHROLLING_FAST
                          ((uint32_t)((ulong)in_stack_fffffffffffff300 >> 0x20),
                           (uint8_t)((ulong)in_stack_fffffffffffff300 >> 0x18),
                           (uint8_t)((ulong)in_stack_fffffffffffff300 >> 0x10),
                           (uint32_t)((ulong)in_stack_fffffffffffff2f8 >> 0x20),
                           (uint32_t)in_stack_fffffffffffff2f8);
        *local_2a0 = uVar3;
        if (local_304 < 0x1000000) {
          uVar4 = *(uint *)(*(long *)(local_2a0 + 2) + (ulong)local_304 * 4);
          local_310 = (ulong)uVar4;
          *(int *)(*(long *)(local_2a0 + 2) + (ulong)local_304 * 4) = (int)local_300;
          if ((local_300 == local_2c8) && (local_310 != 0xffffffff)) {
            uVar4 = (int)local_2c8 - uVar4;
            local_318 = (char *)(ulong)uVar4;
            if (local_318 <= local_2d8) {
              local_320 = local_310 & local_2b8;
              local_288 = (ulong *)(local_2b0 + local_320);
              local_278 = (ulong *)(local_2b0 + local_2f8);
              local_280 = local_2d0;
              local_270 = local_288;
LAB_007eb2ed:
              if (local_280 < (char *)0x8) {
                while( true ) {
                  bVar10 = false;
                  if (local_280 != (char *)0x0) {
                    bVar10 = (char)*local_270 == (char)*local_278;
                  }
                  if (!bVar10) break;
                  local_280 = local_280 + -1;
                  local_278 = (ulong *)((long)local_278 + 1);
                  local_270 = (ulong *)((long)local_270 + 1);
                }
                local_268 = (char *)((long)local_270 - (long)local_288);
              }
              else {
                local_238 = local_278;
                local_240 = *local_278;
                local_248 = local_270;
                local_250 = *local_270;
                local_290 = local_240 ^ local_250;
                local_278 = local_278 + 1;
                if (local_290 == 0) goto LAB_007eb3bf;
                iVar5 = 0;
                for (uVar6 = local_290; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                  iVar5 = iVar5 + 1;
                }
                local_298 = (ulong)iVar5;
                local_268 = (char *)((long)local_270 + ((local_298 >> 3) - (long)local_288));
              }
              local_328 = local_268;
              if (((char *)0x3 < local_268) && (*local_2f0 < local_268)) {
                local_258 = local_268;
                iVar5 = 0x1f;
                if (uVar4 != 0) {
                  for (; uVar4 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                local_330 = (char *)(((long)local_268 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e))
                ;
                local_260 = local_318;
                local_230 = local_318;
                if (local_2f0[2] < local_330) {
                  *local_2f0 = local_268;
                  local_2f0[1] = local_318;
                  local_2f0[2] = local_330;
                  *(undefined4 *)(local_2f0 + 3) = 0;
                }
              }
            }
          }
        }
      }
      *(char **)(local_2a0 + 4) = local_2c8 + 4;
    }
    if (0x7e4 < local_ba0) {
      local_bbc = 0;
      do {
        local_b80 = local_b80 + -1;
        local_bc8 = 0xaf;
        if (*(int *)(local_b20 + 4) < 5) {
          local_a70 = local_bb0 + -1;
          local_a78 = local_b80;
          local_c80 = local_a70;
          if (local_b80 <= local_a70) {
            local_c80 = local_b80;
          }
          local_c88 = local_c80;
        }
        else {
          local_c88 = (char *)0x0;
        }
        local_be8 = local_c88;
        local_bd0 = 0;
        local_be0 = (char *)0x0;
        local_bd8 = 0x7e4;
        local_a80 = local_b00 + 1;
        local_a88 = local_b30;
        local_c90 = local_a80;
        if (local_b30 <= local_a80) {
          local_c90 = local_b30;
        }
        local_b88 = local_c90;
        local_a90 = local_b00 + local_b38 + 1;
        local_a98 = local_b30;
        local_c98 = local_a90;
        if (local_b30 <= local_a90) {
          local_c98 = local_b30;
        }
        local_b90 = local_c98;
        if (*(int *)(local_b20 + 0x270) != 0) {
          local_bb6 = local_bb5;
          bVar1 = *(byte *)(local_b08 + ((ulong)local_b00 & local_b10));
          local_bb4 = (uint)*(byte *)(local_b20 + 0x275 +
                                     (long)(int)(uint)(*(byte *)(local_b18 + (ulong)bVar1) |
                                                      *(byte *)(local_b18 + 0x100 + (ulong)local_bb5
                                                               )));
          local_bb5 = bVar1;
        }
        local_7e8 = *(undefined8 *)(local_b20 + 0x2b8 + (long)(int)local_bb4 * 8);
        local_808 = local_b00 + 1;
        local_820 = local_c98 + local_b70;
        local_828 = *(undefined8 *)(local_b20 + 0x48);
        local_7e0 = local_b28;
        local_7f0 = local_b08;
        local_7f8 = local_b10;
        local_800 = in_stack_00000010;
        local_810 = local_b80;
        local_818 = local_c90;
        local_830 = &local_be8;
        local_408 = local_b28;
        local_418 = local_b08;
        local_420 = local_b10;
        local_428 = in_stack_00000010;
        local_438 = local_b80;
        local_440 = local_c90;
        local_460 = *(long *)(local_b28 + 8);
        local_468 = local_c88;
        local_470 = (ulong)local_808 & local_b10;
        local_474 = (uint)(byte)local_c88[local_b08 + local_470];
        local_458 = local_830;
        local_450 = local_828;
        local_448 = local_820;
        local_430 = local_808;
        local_410 = local_7e8;
        uVar3 = duckdb_brotli::HashBytesH54((uint8_t *)(local_b08 + local_470));
        local_480 = (ulong)uVar3;
        local_490 = local_458[2];
        local_498 = local_458[2];
        local_4a0 = local_468;
        local_4a8 = (char *)(long)*local_428;
        local_4b0 = local_430 + -(long)*local_428;
        *(undefined4 *)(local_458 + 3) = 0;
        if (local_4b0 < local_430) {
          local_4b0 = (char *)(local_420 & 0xffffffff & (ulong)local_4b0);
          if (local_474 == (byte)(local_4b0 + (long)local_4a0)[local_418]) {
            local_3b8 = (ulong *)(local_4b0 + local_418);
            local_3a0 = local_3b8;
            local_3a8 = (ulong *)(local_418 + local_470);
            local_3b0 = local_438;
LAB_007ebb34:
            if (local_3b0 < (char *)0x8) {
              while( true ) {
                bVar10 = false;
                if (local_3b0 != (char *)0x0) {
                  bVar10 = (char)*local_3a0 == (char)*local_3a8;
                }
                if (!bVar10) break;
                local_3b0 = local_3b0 + -1;
                local_3a8 = (ulong *)((long)local_3a8 + 1);
                local_3a0 = (ulong *)((long)local_3a0 + 1);
              }
              local_398 = (char *)((long)local_3a0 - (long)local_3b8);
            }
            else {
              local_360 = local_3a8;
              local_368 = *local_3a8;
              local_370 = local_3a0;
              local_378 = *local_3a0;
              uVar6 = *local_3a8 ^ *local_3a0;
              local_3c0 = uVar6;
              local_3a8 = local_3a8 + 1;
              if (uVar6 == 0) goto LAB_007ebc06;
              iVar5 = 0;
              for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                iVar5 = iVar5 + 1;
              }
              local_3c8 = (long)iVar5;
              local_398 = (char *)((long)local_3a0 + (((ulong)(long)iVar5 >> 3) - (long)local_3b8));
            }
            local_4b8 = local_398;
            if ((char *)0x3 < local_398) {
              local_390 = local_398;
              local_4c0 = (char *)((long)local_398 * 0x87 + 0x78f);
              if (local_498 < local_4c0) {
                *local_458 = local_398;
                local_458[1] = local_4a8;
                local_458[2] = local_4c0;
                local_4a0 = local_4b8;
                local_498 = local_4c0;
                local_474 = (uint)(byte)local_4b8[local_418 + local_470];
              }
            }
          }
        }
        for (local_4f0 = 0; local_4f0 < 4; local_4f0 = local_4f0 + 1) {
          auStack_4e8[local_4f0] = local_480 + local_4f0 * 8 & 0xfffff;
        }
        local_488 = *(long *)((long)auStack_4e8 + ((ulong)local_430 & 0x18));
        for (local_4f0 = 0; local_4f0 < 4; local_4f0 = local_4f0 + 1) {
          uVar6 = (ulong)*(uint *)(local_460 + auStack_4e8[local_4f0] * 4);
          local_500 = local_430 + -uVar6;
          local_4b0 = (char *)(local_420 & 0xffffffff & uVar6);
          if ((local_474 == (byte)(local_4b0 + (long)local_4a0)[local_418]) &&
             (local_500 != (char *)0x0 && local_500 <= local_440)) {
            local_3f0 = (ulong *)(local_4b0 + local_418);
            local_3d8 = local_3f0;
            local_3e0 = (ulong *)(local_418 + local_470);
            local_3e8 = local_438;
LAB_007ebf49:
            if (local_3e8 < (char *)0x8) {
              while( true ) {
                bVar10 = false;
                if (local_3e8 != (char *)0x0) {
                  bVar10 = (char)*local_3d8 == (char)*local_3e0;
                }
                if (!bVar10) break;
                local_3e8 = local_3e8 + -1;
                local_3e0 = (ulong *)((long)local_3e0 + 1);
                local_3d8 = (ulong *)((long)local_3d8 + 1);
              }
              local_3d0 = (char *)((long)local_3d8 - (long)local_3f0);
            }
            else {
              local_340 = local_3e0;
              local_348 = *local_3e0;
              local_350 = local_3d8;
              local_358 = *local_3d8;
              uVar6 = *local_3e0 ^ *local_3d8;
              local_3f8 = uVar6;
              local_3e0 = local_3e0 + 1;
              if (uVar6 == 0) goto LAB_007ec01b;
              iVar5 = 0;
              for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                iVar5 = iVar5 + 1;
              }
              local_400 = (long)iVar5;
              local_3d0 = (char *)((long)local_3d8 + (((ulong)(long)iVar5 >> 3) - (long)local_3f0));
            }
            local_4f8 = local_3d0;
            if ((char *)0x3 < local_3d0) {
              local_380 = local_3d0;
              local_388 = local_500;
              local_338 = local_500;
              iVar5 = 0x1f;
              if ((uint)local_500 != 0) {
                for (; (uint)local_500 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              local_508 = (char *)(((long)local_3d0 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e));
              if (local_498 < local_508) {
                local_4a0 = local_3d0;
                *local_458 = local_3d0;
                local_474 = (uint)(byte)local_4f8[local_418 + local_470];
                local_498 = local_508;
                local_458[2] = local_508;
                local_458[1] = local_500;
              }
            }
          }
        }
        *(int *)(local_460 + local_488 * 4) = (int)local_430;
        local_198 = (uint *)(local_7e0 + 0x10);
        local_1a0 = local_7e8;
        local_1a8 = local_7f0;
        local_1b0 = local_7f8;
        local_1b8 = local_800;
        local_1c0 = local_808;
        local_1c8 = local_810;
        local_1d0 = local_818;
        local_1d8 = local_820;
        local_1e0 = local_828;
        local_1e8 = local_830;
        local_1f0 = (ulong)local_808 & local_7f8;
        if ((((ulong)local_808 & 3) == 0) && ((char *)0x1f < local_810)) {
          for (local_1f8 = *(char **)(local_7e0 + 0x20); local_1f8 <= local_1c0;
              local_1f8 = local_1f8 + 4) {
            local_1fc = *local_198 & 0x3fffffff;
            local_1fd = *(undefined1 *)(local_1a8 + ((ulong)local_1f8 & local_1b0));
            local_1fe = *(undefined1 *)(local_1a8 + ((ulong)(local_1f8 + 0x20) & local_1b0));
            local_208 = 0xffffffff;
            uVar3 = duckdb_brotli::HashRollingFunctionHROLLING_FAST
                              ((uint32_t)((ulong)in_stack_fffffffffffff300 >> 0x20),
                               (uint8_t)((ulong)in_stack_fffffffffffff300 >> 0x18),
                               (uint8_t)((ulong)in_stack_fffffffffffff300 >> 0x10),
                               (uint32_t)((ulong)in_stack_fffffffffffff2f8 >> 0x20),
                               (uint32_t)in_stack_fffffffffffff2f8);
            *local_198 = uVar3;
            if (local_1fc < 0x1000000) {
              uVar4 = *(uint *)(*(long *)(local_198 + 2) + (ulong)local_1fc * 4);
              local_208 = (ulong)uVar4;
              *(int *)(*(long *)(local_198 + 2) + (ulong)local_1fc * 4) = (int)local_1f8;
              if ((local_1f8 == local_1c0) && (local_208 != 0xffffffff)) {
                uVar4 = (int)local_1c0 - uVar4;
                local_210 = (char *)(ulong)uVar4;
                if (local_210 <= local_1d0) {
                  local_218 = local_208 & local_1b0;
                  local_180 = (ulong *)(local_1a8 + local_218);
                  local_170 = (ulong *)(local_1a8 + local_1f0);
                  local_178 = local_1c8;
                  local_168 = local_180;
LAB_007ec507:
                  if (local_178 < (char *)0x8) {
                    while( true ) {
                      bVar10 = false;
                      if (local_178 != (char *)0x0) {
                        bVar10 = (char)*local_168 == (char)*local_170;
                      }
                      if (!bVar10) break;
                      local_178 = local_178 + -1;
                      local_170 = (ulong *)((long)local_170 + 1);
                      local_168 = (ulong *)((long)local_168 + 1);
                    }
                    local_160 = (char *)((long)local_168 - (long)local_180);
                  }
                  else {
                    local_130 = local_170;
                    local_138 = *local_170;
                    local_140 = local_168;
                    local_148 = *local_168;
                    local_188 = local_138 ^ local_148;
                    local_170 = local_170 + 1;
                    if (local_188 == 0) goto LAB_007ec5d9;
                    iVar5 = 0;
                    for (uVar6 = local_188; (uVar6 & 1) == 0;
                        uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                      iVar5 = iVar5 + 1;
                    }
                    local_190 = (ulong)iVar5;
                    local_160 = (char *)((long)local_168 + ((local_190 >> 3) - (long)local_180));
                  }
                  local_220 = local_160;
                  if (((char *)0x3 < local_160) && (*local_1e8 < local_160)) {
                    local_150 = local_160;
                    iVar5 = 0x1f;
                    if (uVar4 != 0) {
                      for (; uVar4 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                      }
                    }
                    local_228 = (char *)(((long)local_160 * 0x87 + 0x780) -
                                        (ulong)(uint)(iVar5 * 0x1e));
                    local_158 = local_210;
                    local_128 = local_210;
                    if (local_1e8[2] < local_228) {
                      *local_1e8 = local_160;
                      local_1e8[1] = local_210;
                      local_1e8[2] = local_228;
                      *(undefined4 *)(local_1e8 + 3) = 0;
                    }
                  }
                }
              }
            }
          }
          *(char **)(local_198 + 4) = local_1c0 + 4;
        }
        pcVar7 = local_b00;
        if (local_bd8 < local_ba0 + 0xaf) break;
        pcVar7 = local_b00 + 1;
        local_b48 = local_b48 + 1;
        local_bb0 = local_be8;
        local_ba8 = local_be0;
        local_ba0 = local_bd8;
        local_b98 = CONCAT44(uStack_bcc,local_bd0);
        local_bbc = local_bbc + 1;
        if (3 < local_bbc) break;
        local_848 = 8;
        local_850 = 4;
        pcVar8 = local_b00 + 9;
        local_b00 = pcVar7;
      } while (pcVar8 < local_b50);
      local_b00 = pcVar7;
      local_b68 = local_b00 + local_b60 + (long)local_bb0 * 2;
      local_aa0 = local_b00 + local_b38;
      local_aa8 = local_b30;
      local_cb8 = local_aa0;
      if (local_b30 <= local_aa0) {
        local_cb8 = local_b30;
      }
      local_b90 = local_cb8;
      local_a28 = local_cb8 + local_b70;
      local_a20 = local_ba8;
      if (local_a28 < local_ba8) {
LAB_007ecb22:
        local_a18 = local_ba8 + 0xf;
      }
      else {
        local_a38 = local_ba8 + 3;
        local_a40 = (long)local_a38 - (long)*in_stack_00000010;
        local_a48 = (long)local_a38 - (long)in_stack_00000010[1];
        if (local_ba8 == (char *)(long)*in_stack_00000010) {
          local_a18 = (char *)0x0;
        }
        else if (local_ba8 == (char *)(long)in_stack_00000010[1]) {
          local_a18 = (char *)0x1;
        }
        else if (local_a40 < 7) {
          local_a18 = (char *)(long)(int)(0x9750468 >>
                                          ((byte)((local_a40 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (local_a48 < 7) {
          local_a18 = (char *)(long)(int)(0xfdb1ace >>
                                          ((byte)((local_a48 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (local_ba8 == (char *)(long)in_stack_00000010[2]) {
          local_a18 = (char *)0x2;
        }
        else {
          if (local_ba8 != (char *)(long)in_stack_00000010[3]) goto LAB_007ecb22;
          local_a18 = (char *)0x3;
        }
      }
      if ((local_ba8 <= local_cb8 + local_b70) && (local_a18 != (char *)0x0)) {
        in_stack_00000010[3] = in_stack_00000010[2];
        in_stack_00000010[2] = in_stack_00000010[1];
        in_stack_00000010[1] = *in_stack_00000010;
        *in_stack_00000010 = (int)local_ba8;
        local_868 = local_b28;
        local_700 = local_b28;
        local_6e0 = local_b28 + 0x10;
      }
      local_9e8 = (uint *)(local_b20 + 0x38);
      local_9e0 = in_stack_00000020;
      local_9f0 = local_b48;
      local_9f8 = local_bb0;
      local_9fc = (uint)local_b98;
      local_a08 = local_a18;
      local_a0c = (uint)local_b98 & 0xff;
      *in_stack_00000020 = (int)local_b48;
      in_stack_00000020[1] = (uint)local_bb0 | local_a0c << 0x19;
      local_958 = (ulong)*(uint *)(local_b20 + 0x3c);
      local_960 = (ulong)*local_9e8;
      local_968 = (ushort *)((long)in_stack_00000020 + 0xe);
      local_970 = in_stack_00000020 + 2;
      local_950 = local_a18;
      if (local_a18 < (char *)(local_958 + 0x10)) {
        *local_968 = (ushort)local_a18;
        *local_970 = 0;
      }
      else {
        bVar1 = (byte)*local_9e8;
        local_978 = local_a18 + (1L << (bVar1 + 2 & 0x3f)) + (-0x10 - local_958);
        iVar5 = 0x1f;
        if ((uint)local_978 != 0) {
          for (; (uint)local_978 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_980 = (ulong)(iVar5 - 1U);
        local_988 = (ulong)((1 << (bVar1 & 0x1f)) - 1);
        local_990 = (ulong)local_978 & local_988;
        bVar9 = (byte)(iVar5 - 1U);
        local_998 = (ulong)local_978 >> (bVar9 & 0x3f) & 1;
        local_9a0 = local_998 + 2 << (bVar9 & 0x3f);
        local_9a8 = local_980 - local_960;
        *local_968 = (short)local_9a8 * 0x400 |
                     (short)*(uint *)(local_b20 + 0x3c) + 0x10 +
                     (short)((local_9a8 + -1) * 2 + local_998 << (bVar1 & 0x3f)) + (short)local_990;
        *local_970 = (int)((ulong)((long)local_978 - local_9a0) >> (bVar1 & 0x3f));
        local_948 = local_978;
      }
      iVar5 = (uint)local_bb0 + (uint)local_b98;
      local_928 = (ulong)iVar5;
      local_92c = (uint)((*(ushort *)((long)in_stack_00000020 + 0xe) & 0x3ff) == 0);
      local_938 = (ushort *)(in_stack_00000020 + 3);
      local_920 = local_b48;
      local_910 = local_b48;
      if (local_b48 < 6) {
        local_902 = (ushort)local_b48;
      }
      else if (local_b48 < 0x82) {
        local_8f8 = local_b48 - 2;
        local_914 = 0x1f;
        if ((uint)local_8f8 != 0) {
          for (; (uint)local_8f8 >> local_914 == 0; local_914 = local_914 + -1) {
          }
        }
        local_914 = local_914 + -1;
        local_902 = (short)local_914 * 2 + (short)(local_b48 - 2 >> ((byte)local_914 & 0x3f)) + 2;
      }
      else if (local_b48 < 0x842) {
        local_900 = local_b48 - 0x42;
        iVar2 = 0x1f;
        if ((uint)local_900 != 0) {
          for (; (uint)local_900 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        local_902 = (short)iVar2 + 10;
      }
      else if (local_b48 < 0x1842) {
        local_902 = 0x15;
      }
      else if (local_b48 < 0x5842) {
        local_902 = 0x16;
      }
      else {
        local_902 = 0x17;
      }
      local_93a = local_902;
      if (local_928 < 10) {
        local_8da = (short)iVar5 - 2;
      }
      else if (local_928 < 0x86) {
        local_8d0 = local_928 - 6;
        local_8ec = 0x1f;
        if ((uint)local_8d0 != 0) {
          for (; (uint)local_8d0 >> local_8ec == 0; local_8ec = local_8ec + -1) {
          }
        }
        local_8ec = local_8ec + -1;
        local_8da = (short)local_8ec * 2 + (short)(local_928 - 6 >> ((byte)local_8ec & 0x3f)) + 4;
      }
      else if (local_928 < 0x846) {
        local_8d8 = local_928 - 0x46;
        iVar5 = 0x1f;
        if ((uint)local_8d8 != 0) {
          for (; (uint)local_8d8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_8da = (short)iVar5 + 0xc;
      }
      else {
        local_8da = 0x17;
      }
      local_93c = local_8da;
      local_8b4 = local_902;
      local_8b6 = local_8da;
      local_8be = local_8da & 7 | (local_902 & 7) << 3;
      if (((local_92c == 0) || (7 < local_902)) || (0xf < local_8da)) {
        iVar5 = ((int)(uint)local_8da >> 3) + ((int)(uint)local_902 >> 3) * 3;
        local_8c4 = iVar5 * 0x40 + 0x40 + (0x520d40U >> ((char)iVar5 * '\x02' & 0x1fU) & 0xc0);
        local_8b2 = (ushort)local_8c4 | local_8be;
      }
      else {
        local_8b2 = local_8be;
        if (7 < local_8da) {
          local_8b2 = local_8be | 0x40;
        }
      }
      *local_938 = local_8b2;
      *in_stack_00000030 = local_b48 + *in_stack_00000030;
      local_b48 = 0;
      pcVar7 = local_b00 + 2;
      local_ab0 = local_b00 + (long)local_bb0;
      local_ab8 = local_b58;
      local_cd0 = local_ab0;
      if (local_b58 <= local_ab0) {
        local_cd0 = local_b58;
      }
      local_bf8 = pcVar7;
      if (local_ba8 < (char *)((ulong)local_bb0 >> 2)) {
        local_9b8 = local_b00 + (long)local_bb0 + (long)local_ba8 * -4;
        local_ce0 = local_9b8;
        if (local_9b8 < pcVar7) {
          local_ce0 = pcVar7;
        }
        local_ac0 = local_cd0;
        local_ac8 = local_ce0;
        if (local_cd0 < local_ce0) {
          local_ce8 = local_cd0;
        }
        else {
          local_ce8 = local_ce0;
        }
        local_bf8 = local_ce8;
        local_9b0 = pcVar7;
      }
      local_760 = local_b28;
      local_768 = local_b08;
      local_770 = local_b10;
      local_778 = local_bf8;
      local_780 = local_cd0;
      local_f8 = local_b28;
      local_100 = local_b08;
      local_108 = local_b10;
      local_110 = local_bf8;
      local_118 = local_cd0;
      local_8e8 = local_928;
      local_8bc = local_92c;
      for (local_120 = local_bf8; local_120 < local_118; local_120 = local_120 + 1) {
        local_a8 = local_f8;
        local_b0 = local_100;
        local_b8 = local_108;
        local_c0 = local_120;
        local_c4 = duckdb_brotli::HashBytesH54
                             ((uint8_t *)(local_100 + ((ulong)local_120 & local_108)));
        local_c8 = (uint)local_c0 & 0x18;
        *(uint *)(*(long *)(local_a8 + 8) + (ulong)(local_c4 + local_c8 & 0xfffff) * 4) =
             (uint)local_c0;
      }
      local_d0 = local_760 + 0x10;
      local_d8 = local_768;
      local_e0 = local_770;
      local_e8 = local_778;
      local_f0 = local_780;
      in_stack_00000020 = in_stack_00000020 + 4;
      pcVar7 = local_bb0 + (long)local_b00;
      goto LAB_007ea339;
    }
    local_b48 = local_b48 + 1;
    pcVar7 = local_b00 + 1;
    if (local_b68 < pcVar7) {
      if (local_b68 + local_b60 * 4 < pcVar7) {
        local_898 = 8;
        local_8a0 = 4;
        local_9c0 = 7;
        local_9c8 = 4;
        local_ad0 = local_b00 + 0x11;
        local_ad8 = local_b50 + -7;
        in_stack_fffffffffffff300 = local_ad8;
        local_b00 = pcVar7;
        pcVar8 = local_ad8;
        if (local_ad0 < local_ad8) {
          in_stack_fffffffffffff300 = local_ad0;
          pcVar8 = local_ad0;
        }
        for (; pcVar7 = local_b00, local_b00 < pcVar8; local_b00 = local_b00 + 4) {
          local_720 = local_b28;
          local_728 = local_b08;
          local_730 = local_b10;
          local_738 = local_b00;
          local_80 = local_b28;
          local_88 = local_b08;
          local_90 = local_b10;
          local_98 = local_b00;
          local_9c = duckdb_brotli::HashBytesH54
                               ((uint8_t *)(local_b08 + ((ulong)local_b00 & local_b10)));
          local_a0 = (uint)local_98 & 0x18;
          *(uint *)(*(long *)(local_80 + 8) + (ulong)(local_9c + local_a0 & 0xfffff) * 4) =
               (uint)local_98;
          local_38 = local_720 + 0x10;
          local_40 = local_728;
          local_48 = local_730;
          local_50 = local_738;
          local_b48 = local_b48 + 4;
        }
      }
      else {
        local_8a8 = 8;
        local_8b0 = 4;
        in_stack_fffffffffffff2f8 = 8;
        local_9d0 = 7;
        local_9d8 = 2;
        local_ae0 = local_b00 + 9;
        local_ae8 = local_b50 + -7;
        local_b00 = pcVar7;
        local_d18 = local_ae8;
        if (local_ae0 < local_ae8) {
          local_d18 = local_ae0;
        }
        for (; pcVar7 = local_b00, local_b00 < local_d18; local_b00 = local_b00 + 2) {
          local_740 = local_b28;
          local_748 = local_b08;
          local_750 = local_b10;
          local_758 = local_b00;
          local_58 = local_b28;
          local_60 = local_b08;
          local_68 = local_b10;
          local_70 = local_b00;
          local_74 = duckdb_brotli::HashBytesH54
                               ((uint8_t *)(local_b08 + ((ulong)local_b00 & local_b10)));
          local_78 = (uint)local_70 & 0x18;
          *(uint *)(*(long *)(local_58 + 8) + (ulong)(local_74 + local_78 & 0xfffff) * 4) =
               (uint)local_70;
          local_18 = local_740 + 0x10;
          local_20 = local_748;
          local_28 = local_750;
          local_30 = local_758;
          local_b48 = local_b48 + 2;
        }
      }
    }
  } while( true );
  local_578 = local_578 + 1;
  local_588 = local_588 + -8;
  goto LAB_007ea8f9;
LAB_007eadf5:
  local_5b0 = local_5b0 + 1;
  local_5c0 = local_5c0 + -8;
  goto LAB_007ead23;
LAB_007eb3bf:
  local_270 = local_270 + 1;
  local_280 = local_280 + -8;
  goto LAB_007eb2ed;
LAB_007ebc06:
  local_3a0 = local_3a0 + 1;
  local_3b0 = local_3b0 + -8;
  goto LAB_007ebb34;
LAB_007ec01b:
  local_3d8 = local_3d8 + 1;
  local_3e8 = local_3e8 + -8;
  goto LAB_007ebf49;
LAB_007ec5d9:
  local_168 = local_168 + 1;
  local_178 = local_178 + -8;
  goto LAB_007ec507;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}